

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O0

StrWriter * __thiscall
moira::StrWriter::operator<<(StrWriter *this,IxMus<(moira::Mode)10,_2> wrapper)

{
  StrWriter *pSVar1;
  char *local_a0;
  bool local_92;
  bool local_91;
  char *local_90;
  Int local_78;
  Scale local_74;
  Rn local_70 [2];
  Int local_68;
  Int local_64;
  byte local_60;
  bool local_5f;
  byte local_5e;
  bool local_5d;
  i32 local_5c;
  bool comma;
  bool effectiveZero;
  bool postindex;
  bool preindex;
  u32 outer;
  u32 base;
  ushort local_4c;
  u16 iis;
  u16 size;
  u16 is;
  u16 bs;
  u16 scale_1;
  u16 lw_1;
  u16 reg_1;
  Int local_38;
  ushort local_32;
  ushort local_30;
  ushort local_2e;
  ushort local_2c;
  u16 disp;
  u16 scale;
  u16 lw;
  u16 reg;
  u16 full;
  Ea<(moira::Mode)10,_2> *ea;
  StrWriter *this_local;
  IxMus<(moira::Mode)10,_2> wrapper_local;
  
  disp = (ushort)((wrapper.ea)->ext1 >> 8) & 1;
  _scale = wrapper.ea;
  ea = (Ea<(moira::Mode)10,_2> *)this;
  this_local = (StrWriter *)wrapper.ea;
  if (((wrapper.ea)->ext1 & 0x100) == 0) {
    local_2c = (ushort)((wrapper.ea)->ext1 >> 0xc) & 0xf;
    local_2e = (ushort)((wrapper.ea)->ext1 >> 0xb) & 1;
    local_30 = (ushort)((wrapper.ea)->ext1 >> 9) & 3;
    local_32 = (ushort)(wrapper.ea)->ext1 & 0xff;
    operator<<(this,"(");
    if (local_32 != 0) {
      Int::Int(&local_38,(int)(char)local_32);
      pSVar1 = operator<<(this,local_38);
      operator<<(pSVar1,",");
    }
    operator<<(this);
    pSVar1 = operator<<(this,",");
    Rn::Rn((Rn *)&lw_1,(uint)local_2c);
    operator<<(pSVar1,_lw_1);
    if (local_2e == 0) {
      local_90 = "$%x.w";
    }
    else {
      local_90 = "$%x.l";
    }
    local_90 = local_90 + 3;
    operator<<(this,local_90);
    Scale::Scale((Scale *)&bs,(uint)local_30);
    pSVar1 = operator<<(this,_bs);
    operator<<(pSVar1,")");
  }
  else {
    is = (ushort)((wrapper.ea)->ext1 >> 0xc) & 0xf;
    size = (ushort)((wrapper.ea)->ext1 >> 0xb) & 1;
    iis = (ushort)((wrapper.ea)->ext1 >> 9) & 3;
    local_4c = (ushort)((wrapper.ea)->ext1 >> 7) & 1;
    base._2_2_ = (ushort)((wrapper.ea)->ext1 >> 6) & 1;
    base._0_2_ = (ushort)((wrapper.ea)->ext1 >> 4) & 3;
    outer._2_2_ = (ushort)(wrapper.ea)->ext1 & 7;
    _comma = (wrapper.ea)->ext2;
    local_5c = (wrapper.ea)->ext3;
    local_91 = ((wrapper.ea)->ext1 & 7) != 0 && outer._2_2_ < 4;
    local_5d = local_91;
    local_5e = 4 < outer._2_2_;
    local_92 = true;
    if (((wrapper.ea)->ext1 & 0xe4) != 0xc4) {
      local_92 = ((wrapper.ea)->ext1 & 0xe2) == 0xc0;
    }
    local_5f = local_92;
    local_60 = 0;
    if (local_92 == false) {
      operator<<(this,"(");
      if (((local_5d & 1U) != 0) || ((local_5e & 1) != 0)) {
        operator<<(this,"[");
      }
      if (_comma != 0) {
        if ((ushort)base == 3) {
          Int::Int(&local_64,_comma);
          operator<<(this,local_64);
        }
        else {
          Int::Int(&local_68,(int)(short)_comma);
          operator<<(this,local_68);
        }
        local_60 = 1;
      }
      if (local_4c == 0) {
        if ((local_60 & 1) != 0) {
          operator<<(this,",");
        }
        operator<<(this);
        local_60 = 1;
      }
      if ((local_5e & 1) != 0) {
        operator<<(this,"]");
        local_60 = 1;
      }
      if (base._2_2_ == 0) {
        if ((local_60 & 1) != 0) {
          operator<<(this,",");
        }
        Rn::Rn(local_70,(uint)is);
        operator<<(this,local_70[0]);
        if (size == 0) {
          local_a0 = "$%x.w";
        }
        else {
          local_a0 = "$%x.l";
        }
        local_a0 = local_a0 + 3;
        operator<<(this,local_a0);
        Scale::Scale(&local_74,(uint)iis);
        operator<<(this,local_74);
        local_60 = 1;
      }
      if ((local_5d & 1U) != 0) {
        operator<<(this,"]");
        local_60 = 1;
      }
      if (local_5c != 0) {
        if ((local_60 & 1) != 0) {
          operator<<(this,",");
        }
        Int::Int(&local_78,local_5c);
        operator<<(this,local_78);
      }
      operator<<(this,")");
    }
    else {
      operator<<(this,"0");
    }
  }
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(IxMus<M, S> wrapper)
{
    assert(M == Mode(6) || M == Mode(10));

    auto &ea = wrapper.ea;

    u16 full = _______x________ (ea.ext1);

    if (!full) {

        //   15-12   11   10   09   08   07   06   05   04   03   02   01   00
        // --------------------------------------------------------------------
        // | REG   | LW | SCALE   | 0  | DISPLACEMENT                         |
        // --------------------------------------------------------------------

        u16 reg   = xxxx____________ (ea.ext1);
        u16 lw    = ____x___________ (ea.ext1);
        u16 scale = _____xx_________ (ea.ext1);
        u16 disp  = ________xxxxxxxx (ea.ext1);

        *this << "(";
        if (disp) *this << Int{(i8)disp} << ",";
        M == Mode(10) ? *this << Pc{} : *this << An{ea.reg};
        *this << "," << Rn{reg};
        *this << (lw ? ".l" : ".w");
        *this << Scale{scale} << ")";

    } else {

        //   15-12   11   10   09   08   07   06   05   04   03   02   01   00
        // --------------------------------------------------------------------
        // | REG   | LW | SCALE   | 1  | BS | IS | BD SIZE  | 0  | IIS        |
        // --------------------------------------------------------------------

        u16  reg   = xxxx____________ (ea.ext1);
        u16  lw    = ____x___________ (ea.ext1);
        u16  scale = _____xx_________ (ea.ext1);
        u16  bs    = ________x_______ (ea.ext1);
        u16  is    = _________x______ (ea.ext1);
        u16  size  = __________xx____ (ea.ext1);
        u16  iis   = _____________xxx (ea.ext1);
        u32  base  = ea.ext2;
        u32  outer = ea.ext3;

        bool preindex = (iis > 0 && iis < 4);
        bool postindex = (iis > 4);
        bool effectiveZero = (ea.ext1 & 0xe4) == 0xC4 || (ea.ext1 & 0xe2) == 0xC0;
        bool comma = false;

        if (effectiveZero) {

            *this << "0";
            return *this;
        }

        *this << "(";

        if (preindex || postindex) {

            *this << "[";
        }
        if (base) {

            size == 3 ? (*this << Int{(i32)base}) : (*this << Int{(i16)base});
            comma = true;
        }
        if (!bs) {

            if (comma) *this << ",";
            M == Mode(10) ? *this << Pc{} : *this << An{ea.reg};
            comma = true;
        }
        if (postindex) {

            *this << "]";
            comma = true;
        }
        if (!is) {

            if (comma) *this << ",";
            *this << Rn{reg};
            *this << (lw ? ".l" : ".w");
            *this << Scale{scale};
            comma = true;
        }
        if (preindex) {

            *this << "]";
            comma = true;
        }
        if(outer)
        {
            if (comma) *this << ",";
            *this << Int(outer);
        }

        *this << ")";
    }

    return *this;
}